

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O0

void ImGui::SetWindowCollapsed(char *name,bool collapsed,ImGuiCond cond)

{
  ImGuiWindow *window_00;
  ImGuiCond in_EDX;
  byte in_SIL;
  ImGuiWindow *window;
  undefined3 in_stack_fffffffffffffff4;
  byte bVar1;
  
  bVar1 = in_SIL & 1;
  window_00 = FindWindowByName((char *)(CONCAT44(CONCAT13(in_SIL,in_stack_fffffffffffffff4),in_EDX)
                                       & 0x1ffffffffffffff));
  if (window_00 != (ImGuiWindow *)0x0) {
    SetWindowCollapsed(window_00,(bool)(bVar1 & 1),in_EDX);
  }
  return;
}

Assistant:

void ImGui::SetWindowCollapsed(const char* name, bool collapsed, ImGuiCond cond)
{
    if (ImGuiWindow* window = FindWindowByName(name))
        SetWindowCollapsed(window, collapsed, cond);
}